

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O1

vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> * __thiscall
spvtools::opt::analysis::DecorationManager::InternalGetDecorationsFor<spvtools::opt::Instruction*>
          (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           *__return_storage_ptr__,DecorationManager *this,uint32_t id,bool include_linkage)

{
  pointer *pppIVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  iterator iVar4;
  Instruction *this_00;
  uint32_t uVar5;
  __node_base_ptr p_Var6;
  _Hash_node_base *p_Var7;
  ulong uVar8;
  uint uVar9;
  __node_base_ptr p_Var10;
  __node_base_ptr p_Var11;
  _Hash_node_base *p_Var12;
  bool bVar13;
  Instruction *local_48;
  _Hash_node_base *local_40;
  DecorationManager *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = (this->id_to_decoration_insts_)._M_h._M_bucket_count;
  uVar8 = (ulong)id % uVar2;
  p_Var10 = (this->id_to_decoration_insts_)._M_h._M_buckets[uVar8];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var10 != (__node_base_ptr)0x0) &&
     (p_Var7 = p_Var10->_M_nxt, p_Var6 = p_Var10, *(uint32_t *)&p_Var10->_M_nxt[1]._M_nxt != id)) {
    while (p_Var10 = p_Var7, p_Var7 = p_Var10->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var7[1]._M_nxt % uVar2 != uVar8) ||
         (p_Var6 = p_Var10, *(uint *)&p_Var7[1]._M_nxt == id)) goto LAB_00598999;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_00598999:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var7 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var7 = p_Var6->_M_nxt;
  }
  if (p_Var7 != (_Hash_node_base *)0x0) {
    p_Var3 = p_Var7[3]._M_nxt;
    local_38 = this;
    for (p_Var12 = p_Var7[2]._M_nxt; p_Var12 != p_Var3; p_Var12 = p_Var12 + 1) {
      local_48 = (Instruction *)p_Var12->_M_nxt;
      bVar13 = true;
      if (local_48->opcode_ == OpDecorate) {
        uVar9 = (local_48->has_result_id_ & 1) + 1;
        if (local_48->has_type_id_ == false) {
          uVar9 = (uint)local_48->has_result_id_;
        }
        uVar5 = Instruction::GetSingleWordOperand(local_48,uVar9 + 1);
        bVar13 = uVar5 != 0x29;
      }
      if ((bVar13 | include_linkage) == 1) {
        iVar4._M_current =
             (__return_storage_ptr__->
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
          _M_realloc_insert<spvtools::opt::Instruction*const&>
                    ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                      *)__return_storage_ptr__,iVar4,&local_48);
        }
        else {
          *iVar4._M_current = local_48;
          pppIVar1 = &(__return_storage_ptr__->
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppIVar1 = *pppIVar1 + 1;
        }
      }
    }
    p_Var12 = p_Var7[5]._M_nxt;
    local_40 = p_Var7[6]._M_nxt;
    if (p_Var12 != local_40) {
      do {
        this_00 = (Instruction *)p_Var12->_M_nxt;
        uVar5 = (this_00->has_result_id_ & 1) + 1;
        if (this_00->has_type_id_ == false) {
          uVar5 = (uint)this_00->has_result_id_;
        }
        uVar5 = Instruction::GetSingleWordOperand(this_00,uVar5);
        uVar2 = (local_38->id_to_decoration_insts_)._M_h._M_bucket_count;
        uVar8 = (ulong)uVar5 % uVar2;
        p_Var10 = (local_38->id_to_decoration_insts_)._M_h._M_buckets[uVar8];
        p_Var6 = (__node_base_ptr)0x0;
        if ((p_Var10 != (__node_base_ptr)0x0) &&
           (p_Var6 = p_Var10, p_Var11 = p_Var10->_M_nxt,
           uVar5 != *(uint32_t *)&p_Var10->_M_nxt[1]._M_nxt)) {
          while (p_Var7 = p_Var11->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
            p_Var6 = (__node_base_ptr)0x0;
            if (((ulong)*(uint *)&p_Var7[1]._M_nxt % uVar2 != uVar8) ||
               (p_Var6 = p_Var11, p_Var11 = p_Var7, uVar5 == *(uint *)&p_Var7[1]._M_nxt))
            goto LAB_00598ab1;
          }
          p_Var6 = (__node_base_ptr)0x0;
        }
LAB_00598ab1:
        if (p_Var6 == (__node_base_ptr)0x0) {
          p_Var7 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var7 = p_Var6->_M_nxt;
        }
        if (p_Var7 == (_Hash_node_base *)0x0) {
          __assert_fail("group_iter != id_to_decoration_insts_.end() && \"Unknown group ID\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/decoration_manager.cpp"
                        ,0x1c7,
                        "std::vector<T> spvtools::opt::analysis::DecorationManager::InternalGetDecorationsFor(uint32_t, bool) [T = spvtools::opt::Instruction *]"
                       );
        }
        p_Var3 = p_Var7[3]._M_nxt;
        for (p_Var7 = p_Var7[2]._M_nxt; p_Var7 != p_Var3; p_Var7 = p_Var7 + 1) {
          local_48 = (Instruction *)p_Var7->_M_nxt;
          bVar13 = true;
          if (local_48->opcode_ == OpDecorate) {
            uVar9 = (local_48->has_result_id_ & 1) + 1;
            if (local_48->has_type_id_ == false) {
              uVar9 = (uint)local_48->has_result_id_;
            }
            uVar5 = Instruction::GetSingleWordOperand(local_48,uVar9 + 1);
            bVar13 = uVar5 != 0x29;
          }
          if ((bVar13 | include_linkage) == 1) {
            iVar4._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
              _M_realloc_insert<spvtools::opt::Instruction*const&>
                        ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                          *)__return_storage_ptr__,iVar4,&local_48);
            }
            else {
              *iVar4._M_current = local_48;
              pppIVar1 = &(__return_storage_ptr__->
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
              *pppIVar1 = *pppIVar1 + 1;
            }
          }
        }
        p_Var12 = p_Var12 + 1;
      } while (p_Var12 != local_40);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> DecorationManager::InternalGetDecorationsFor(
    uint32_t id, bool include_linkage) {
  std::vector<T> decorations;

  const auto ids_iter = id_to_decoration_insts_.find(id);
  // |id| has no decorations
  if (ids_iter == id_to_decoration_insts_.end()) return decorations;

  const TargetData& target_data = ids_iter->second;

  const auto process_direct_decorations =
      [include_linkage,
       &decorations](const std::vector<Instruction*>& direct_decorations) {
        for (Instruction* inst : direct_decorations) {
          const bool is_linkage =
              inst->opcode() == spv::Op::OpDecorate &&
              spv::Decoration(inst->GetSingleWordInOperand(1u)) ==
                  spv::Decoration::LinkageAttributes;
          if (include_linkage || !is_linkage) decorations.push_back(inst);
        }
      };

  // Process |id|'s decorations.
  process_direct_decorations(ids_iter->second.direct_decorations);

  // Process the decorations of all groups applied to |id|.
  for (const Instruction* inst : target_data.indirect_decorations) {
    const uint32_t group_id = inst->GetSingleWordInOperand(0u);
    const auto group_iter = id_to_decoration_insts_.find(group_id);
    assert(group_iter != id_to_decoration_insts_.end() && "Unknown group ID");
    process_direct_decorations(group_iter->second.direct_decorations);
  }

  return decorations;
}